

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_listener.hpp
# Opt level: O2

TestEventListener * __thiscall
iutest::TestEventListeners::Release(TestEventListeners *this,TestEventListener *listener)

{
  TestEventListener *pTVar1;
  __normal_iterator<iutest::TestEventListener_**,_std::vector<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>_>
  __position;
  
  if (this->m_default_result_printer == listener) {
    this->m_default_result_printer = (TestEventListener *)0x0;
  }
  if (this->m_default_xml_generator == listener) {
    this->m_default_xml_generator = (TestEventListener *)0x0;
    pTVar1 = TestEventRepeater::Release(&this->m_repeater,listener);
    return pTVar1;
  }
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<iutest::TestEventListener**,std::vector<iutest::TestEventListener*,std::allocator<iutest::TestEventListener*>>>,__gnu_cxx::__ops::_Iter_equals_val<iutest::TestEventListener*const>>
                         ((this->m_repeater).m_listeners.
                          super__Vector_base<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->m_repeater).m_listeners.
                          super__Vector_base<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  if (__position._M_current ==
      (this->m_repeater).m_listeners.
      super__Vector_base<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    listener = (TestEventListener *)0x0;
  }
  else {
    std::vector<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>::erase
              (&(this->m_repeater).m_listeners,(const_iterator)__position._M_current);
  }
  return listener;
}

Assistant:

TestEventListener* Release(TestEventListener* listener)
    {
        if( listener == m_default_result_printer )
        {
            m_default_result_printer = NULL;
        }
        if( listener == m_default_xml_generator )
        {
            m_default_xml_generator = NULL;
        }
        return m_repeater.Release(listener);
    }